

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_aa2a52::HandleImportedRuntimeArtifactsMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *this;
  cmInstallCommandArguments *typeArgs;
  cmMakefile *this_00;
  pointer pbVar1;
  pointer ppcVar2;
  bool bVar3;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  cmArgumentParser<void> *this_01;
  string *psVar7;
  cmGlobalGenerator *pcVar8;
  cmInstallRuntimeDependencySet *pcVar9;
  cmTarget *this_02;
  pointer ppcVar10;
  cmInstallImportedRuntimeArtifactsGenerator *pcVar11;
  bool bVar12;
  bool bVar13;
  cmInstallImportedRuntimeArtifactsGenerator *pcVar14;
  bool bVar15;
  _Alloc_hider library;
  pointer name;
  _Head_base<0UL,_cmInstallGenerator_*,_false> executable;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  char local_c91;
  cmInstallRuntimeDependencySet *local_c90;
  cmInstallImportedRuntimeArtifactsGenerator *local_c88;
  string system;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_c50;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_c48;
  __uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_c40;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_c38;
  cmAlphaNum local_c30;
  cmTarget *target;
  ulong local_be0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  Helper helper;
  anon_class_48_1_585e00ec createInstallGenerator;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targetList;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> targets;
  string runtimeDependencySetArg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genericArgVector;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  string local_a38;
  ArgVectors argVectors;
  ParseResult local_9b8;
  ParseResult local_988;
  ParseResult local_958;
  ParseResult local_928;
  ParseResult local_8f8;
  cmInstallCommandArguments genericArgs;
  cmInstallCommandArguments bundleArgs;
  cmInstallCommandArguments frameworkArgs;
  cmInstallCommandArguments runtimeArgs;
  cmInstallCommandArguments libraryArgs;
  
  Helper::Helper(&helper,status);
  targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((anonymous_namespace)::
       HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::argHelper == '\0') &&
     (iVar6 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::argHelper), iVar6 != 0)) {
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker =
         (_Invoker_type)0x0;
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_functor._8_8_ = 0;
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_manager = (_Manager_type)0x0;
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue._M_invoker =
         (_Invoker_type)0x0;
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_functor._M_unused._M_object = (void *)0x0;
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
    super__Function_base._M_functor._8_8_ = 0;
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
    super__Function_base._M_manager = (_Manager_type)0x0;
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
    super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    name_02.super_string_view._M_str = "LIBRARY";
    name_02.super_string_view._M_len = 7;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&genericArgs,name_02,0);
    name_03.super_string_view._M_str = "RUNTIME";
    name_03.super_string_view._M_len = 7;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&genericArgs,name_03,0x18);
    name_04.super_string_view._M_str = "FRAMEWORK";
    name_04.super_string_view._M_len = 9;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&genericArgs,name_04,0x30);
    name_05.super_string_view._M_str = "BUNDLE";
    name_05.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&genericArgs,name_05,0x48);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleImportedRuntimeArtifactsMode::argHelper,(ActionMap *)&genericArgs
              );
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)&genericArgs);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleImportedRuntimeArtifactsMode::argHelper,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::argHelper);
  }
  genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&genericArgVector;
  genericArgVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  genericArgVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  genericArgVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
  super__Function_base._M_functor._M_unused._M_object = &argVectors;
  argVectors.Bundle.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  argVectors.Bundle.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argVectors.Framework.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argVectors.Bundle.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  argVectors.Framework.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  argVectors.Framework.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  argVectors.Runtime.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  argVectors.Runtime.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argVectors.Library.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argVectors.Runtime.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&HandleImportedRuntimeArtifactsMode::argHelper;
  genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  argVectors.Library.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  argVectors.Library.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
  super__Function_base._M_functor._8_8_ = 0;
  genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
  super__Function_base._M_manager = (_Manager_type)0x0;
  genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue._M_invoker =
       (_Invoker_type)0x0;
  genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
  _M_functor._M_unused._M_object = (void *)0x0;
  genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
  _M_functor._8_8_ = 0;
  genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
  _M_manager = (_Manager_type)0x0;
  genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker =
       (_Invoker_type)0x0;
  genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
                        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                        .
                        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)&genericArgs,args,0);
  std::_Function_base::~_Function_base
            ((_Function_base *)
             ((long)&genericArgs.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.
                     super__Function_base._M_functor + 8));
  targetList.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  runtimeDependencySetArg._M_dataplus._M_p = (pointer)&runtimeDependencySetArg.field_2;
  runtimeDependencySetArg._M_string_length = 0;
  targetList.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  targetList.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  runtimeDependencySetArg.field_2._M_local_buf[0] = '\0';
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = &helper.DefaultComponentName;
  std::__cxx11::string::string((string *)&local_a38,(string *)this);
  cmInstallCommandArguments::cmInstallCommandArguments(&genericArgs,&local_a38);
  std::__cxx11::string::~string((string *)&local_a38);
  name_00.super_string_view._M_str = "IMPORTED_RUNTIME_ARTIFACTS";
  name_00.super_string_view._M_len = 0x1a;
  this_01 = cmArgumentParser<void>::
            Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (&genericArgs.super_cmArgumentParser<void>,name_00,&targetList);
  name_01.super_string_view._M_str = "RUNTIME_DEPENDENCY_SET";
  name_01.super_string_view._M_len = 0x16;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_01,name_01,&runtimeDependencySetArg);
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_8f8,&genericArgs.super_cmArgumentParser<void>,&genericArgVector,&unknownArgs,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_8f8);
  bVar3 = cmInstallCommandArguments::Finalize(&genericArgs);
  std::__cxx11::string::string((string *)&local_a58,(string *)this);
  cmInstallCommandArguments::cmInstallCommandArguments(&libraryArgs,&local_a58);
  std::__cxx11::string::~string((string *)&local_a58);
  std::__cxx11::string::string((string *)&local_a78,(string *)this);
  cmInstallCommandArguments::cmInstallCommandArguments(&runtimeArgs,&local_a78);
  std::__cxx11::string::~string((string *)&local_a78);
  std::__cxx11::string::string((string *)&local_a98,(string *)this);
  cmInstallCommandArguments::cmInstallCommandArguments(&frameworkArgs,&local_a98);
  std::__cxx11::string::~string((string *)&local_a98);
  std::__cxx11::string::string((string *)&local_ab8,(string *)this);
  cmInstallCommandArguments::cmInstallCommandArguments(&bundleArgs,&local_ab8);
  std::__cxx11::string::~string((string *)&local_ab8);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_928,&libraryArgs.super_cmArgumentParser<void>,&argVectors.Library,&unknownArgs,0
            );
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_928);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_958,&runtimeArgs.super_cmArgumentParser<void>,&argVectors.Runtime,&unknownArgs,0
            );
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_958);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_988,&frameworkArgs.super_cmArgumentParser<void>,&argVectors.Framework,
             &unknownArgs,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_988);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_9b8,&bundleArgs.super_cmArgumentParser<void>,&argVectors.Bundle,&unknownArgs,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_9b8);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bundleArgs.GenericArguments = &genericArgs;
    frameworkArgs.GenericArguments = &genericArgs;
    runtimeArgs.GenericArguments = &genericArgs;
    libraryArgs.GenericArguments = &genericArgs;
    if ((((bVar3) && (bVar3 = cmInstallCommandArguments::Finalize(&libraryArgs), bVar3)) &&
        (bVar3 = cmInstallCommandArguments::Finalize(&runtimeArgs), bVar3)) &&
       ((bVar3 = cmInstallCommandArguments::Finalize(&frameworkArgs), bVar3 &&
        (bVar3 = cmInstallCommandArguments::Finalize(&bundleArgs), this_00 = helper.Makefile, bVar3)
        ))) {
      if (runtimeDependencySetArg._M_string_length == 0) {
        pcVar9 = (cmInstallRuntimeDependencySet *)0x0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&createInstallGenerator,"CMAKE_HOST_SYSTEM_NAME",
                   (allocator<char> *)&local_c30);
        psVar7 = cmMakefile::GetSafeDefinition(this_00,(string *)&createInstallGenerator);
        std::__cxx11::string::string((string *)&system,(string *)psVar7);
        std::__cxx11::string::~string((string *)&createInstallGenerator);
        bVar3 = cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(&system);
        if (bVar3) {
          pcVar8 = cmMakefile::GetGlobalGenerator(helper.Makefile);
          pcVar9 = cmGlobalGenerator::GetNamedRuntimeDependencySet(pcVar8,&runtimeDependencySetArg);
        }
        else {
          createInstallGenerator.helper.Status = (cmExecutionStatus *)0x4e;
          createInstallGenerator.helper.Makefile = (cmMakefile *)anon_var_dwarf_ad6cac;
          local_c30.View_._M_len = system._M_string_length;
          local_c30.View_._M_str = system._M_dataplus._M_p;
          local_c91 = '\"';
          cmStrCat<char>((string *)&target,(cmAlphaNum *)&createInstallGenerator,&local_c30,
                         &local_c91);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&target);
          pcVar9 = (cmInstallRuntimeDependencySet *)0x0;
        }
        std::__cxx11::string::~string((string *)&system);
        if (!bVar3) goto LAB_002a6dc1;
      }
      pbVar1 = targetList.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_c90 = pcVar9;
      if (targetList.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          targetList.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar3 = true;
      }
      else {
        for (name = targetList.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; name != pbVar1; name = name + 1) {
          bVar3 = cmMakefile::IsAlias(helper.Makefile,name);
          if (bVar3) {
            createInstallGenerator.helper.Status = (cmExecutionStatus *)&DAT_00000029;
            createInstallGenerator.helper.Makefile = (cmMakefile *)anon_var_dwarf_ad6cc4;
            local_c30.View_._M_str = (name->_M_dataplus)._M_p;
            local_c30.View_._M_len = name->_M_string_length;
            cmStrCat<char[21]>(&system,(cmAlphaNum *)&createInstallGenerator,&local_c30,
                               (char (*) [21])"\" which is an alias.");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_002a6b26;
          }
          target = cmMakefile::FindTargetToUse(helper.Makefile,name,false);
          if ((target == (cmTarget *)0x0) || (bVar3 = cmTarget::IsImported(target), !bVar3)) {
            pcVar8 = cmMakefile::GetGlobalGenerator(helper.Makefile);
            this_02 = cmGlobalGenerator::FindTarget(pcVar8,name,true);
            if ((this_02 == (cmTarget *)0x0) || (bVar3 = cmTarget::IsImported(this_02), !bVar3))
            goto LAB_002a6d63;
          }
          else {
LAB_002a6d63:
            this_02 = target;
            if (target == (cmTarget *)0x0) {
              createInstallGenerator.helper.Status = (cmExecutionStatus *)&DAT_00000029;
              createInstallGenerator.helper.Makefile = (cmMakefile *)anon_var_dwarf_ad6cc4;
              local_c30.View_._M_str = (name->_M_dataplus)._M_p;
              local_c30.View_._M_len = name->_M_string_length;
              cmStrCat<char[24]>(&system,(cmAlphaNum *)&createInstallGenerator,&local_c30,
                                 (char (*) [24])"\" which does not exist.");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002a6b26;
            }
          }
          target = this_02;
          TVar5 = cmTarget::GetType(target);
          if (((TVar5 != EXECUTABLE) && (TVar5 = cmTarget::GetType(target), TVar5 != SHARED_LIBRARY)
              ) && (TVar5 = cmTarget::GetType(target), TVar5 != MODULE_LIBRARY)) {
            createInstallGenerator.helper.Status = (cmExecutionStatus *)&DAT_00000029;
            createInstallGenerator.helper.Makefile = (cmMakefile *)anon_var_dwarf_ad6cc4;
            local_c30.View_._M_str = (name->_M_dataplus)._M_p;
            local_c30.View_._M_len = name->_M_string_length;
            cmStrCat<char[50]>(&system,(cmAlphaNum *)&createInstallGenerator,&local_c30,
                               (char (*) [50])"\" which is not an executable, library, or module.");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_002a6b26;
          }
          std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::push_back(&targets,&target);
        }
        createInstallGenerator.helper.Status = helper.Status;
        createInstallGenerator.helper.Makefile = helper.Makefile;
        std::__cxx11::string::string
                  ((string *)&createInstallGenerator.helper.DefaultComponentName,(string *)this);
        ppcVar2 = targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        bVar12 = false;
        local_be0 = 0;
        bVar13 = false;
        bVar15 = false;
        for (ppcVar10 = targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                        super__Vector_impl_data._M_start; bVar3 = ppcVar10 == ppcVar2, !bVar3;
            ppcVar10 = ppcVar10 + 1) {
          typeArgs = (cmInstallCommandArguments *)*ppcVar10;
          TVar5 = cmTarget::GetType((cmTarget *)typeArgs);
          if (TVar5 == EXECUTABLE) {
            bVar4 = cmTarget::IsAppBundleOnApple((cmTarget *)typeArgs);
            if (bVar4) {
              psVar7 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&bundleArgs);
              if (psVar7->_M_string_length == 0) {
                local_c30.View_._M_len = 0x5c;
                local_c30.View_._M_str =
                     "IMPORTED_RUNTIME_ARTIFACTS given no BUNDLE DESTINATION for MACOSX_BUNDLE executable target \""
                ;
                psVar7 = cmTarget::GetName_abi_cxx11_((cmTarget *)typeArgs);
                system._M_string_length = (size_type)(psVar7->_M_dataplus)._M_p;
                system._M_dataplus._M_p = (pointer)psVar7->_M_string_length;
                cmStrCat<char[3]>((string *)&target,&local_c30,(cmAlphaNum *)&system,
                                  (char (*) [3])0x5b59a8);
                std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002a762a:
                std::__cxx11::string::~string((string *)&target);
                goto LAB_002a7637;
              }
              cmInstallCommandArguments::GetDestination_abi_cxx11_(&bundleArgs);
              HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                        ((anon_class_48_1_585e00ec *)&local_c30,(cmTarget *)&createInstallGenerator,
                         typeArgs,(string *)&bundleArgs);
              pcVar11 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c30.View_._M_len;
              if ((local_c90 != (cmInstallRuntimeDependencySet *)0x0) &&
                 (bVar4 = cmInstallRuntimeDependencySet::AddBundleExecutable
                                    (local_c90,
                                     (cmInstallImportedRuntimeArtifactsGenerator *)
                                     local_c30.View_._M_len), !bVar4)) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_c30,
                           "A runtime dependency set may only have one bundle executable.",
                           (allocator<char> *)&system);
                std::__cxx11::string::_M_assign((string *)&(helper.Status)->Error);
                std::__cxx11::string::~string((string *)&local_c30);
                if (pcVar11 != (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
                  (*(pcVar11->super_cmInstallGenerator).super_cmScriptGenerator.
                    _vptr_cmScriptGenerator[1])(pcVar11);
                }
                goto LAB_002a7637;
              }
              library._M_p = (pointer)0x0;
              executable._M_head_impl = (cmInstallGenerator *)0x0;
              pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
            }
            else {
              (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
                        ((string *)&local_c30,&helper,&runtimeArgs);
              HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                        ((anon_class_48_1_585e00ec *)&system,(cmTarget *)&createInstallGenerator,
                         typeArgs,(string *)&runtimeArgs);
              executable._M_head_impl = (cmInstallGenerator *)system._M_dataplus;
              system._M_dataplus._M_p = (pointer)0x0;
              std::__cxx11::string::~string((string *)&local_c30);
              if (local_c90 == (cmInstallRuntimeDependencySet *)0x0) {
LAB_002a71aa:
                library._M_p = (pointer)0x0;
                goto LAB_002a721d;
              }
              library._M_p = (pointer)0x0;
              pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
              cmInstallRuntimeDependencySet::AddExecutable
                        (local_c90,
                         (cmInstallImportedRuntimeArtifactsGenerator *)executable._M_head_impl);
              pcVar11 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
            }
          }
          else if (TVar5 == SHARED_LIBRARY) {
            bVar4 = cmTarget::IsDLLPlatform((cmTarget *)typeArgs);
            if (bVar4) {
              (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
                        ((string *)&local_c30,&helper,&runtimeArgs);
              HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                        ((anon_class_48_1_585e00ec *)&system,(cmTarget *)&createInstallGenerator,
                         typeArgs,(string *)&runtimeArgs);
              executable._M_head_impl = (cmInstallGenerator *)system._M_dataplus;
              system._M_dataplus._M_p = (pointer)0x0;
              std::__cxx11::string::~string((string *)&local_c30);
              if (local_c90 == (cmInstallRuntimeDependencySet *)0x0) goto LAB_002a71aa;
              library._M_p = (pointer)0x0;
              pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
              cmInstallRuntimeDependencySet::AddLibrary
                        (local_c90,
                         (cmInstallImportedRuntimeArtifactsGenerator *)executable._M_head_impl);
              pcVar11 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
            }
            else {
              bVar4 = cmTarget::IsFrameworkOnApple((cmTarget *)typeArgs);
              if (bVar4) {
                psVar7 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&frameworkArgs);
                if (psVar7->_M_string_length == 0) {
                  local_c30.View_._M_len = 0x5f;
                  local_c30.View_._M_str =
                       "IMPORTED_RUNTIME_ARTIFACTS given no FRAMEWORK DESTINATION for shared library FRAMEWORK target \""
                  ;
                  psVar7 = cmTarget::GetName_abi_cxx11_((cmTarget *)typeArgs);
                  system._M_string_length = (size_type)(psVar7->_M_dataplus)._M_p;
                  system._M_dataplus._M_p = (pointer)psVar7->_M_string_length;
                  cmStrCat<char[3]>((string *)&target,&local_c30,(cmAlphaNum *)&system,
                                    (char (*) [3])0x5b59a8);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                  goto LAB_002a762a;
                }
                cmInstallCommandArguments::GetDestination_abi_cxx11_(&frameworkArgs);
                HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                          ((anon_class_48_1_585e00ec *)&local_c30,
                           (cmTarget *)&createInstallGenerator,typeArgs,(string *)&frameworkArgs);
                pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c30.View_._M_len;
                if (local_c90 == (cmInstallRuntimeDependencySet *)0x0) {
                  library._M_p = (pointer)0x0;
                  executable._M_head_impl = (cmInstallGenerator *)0x0;
                  goto LAB_002a721f;
                }
                library._M_p = (pointer)0x0;
                executable._M_head_impl = (cmInstallGenerator *)0x0;
                cmInstallRuntimeDependencySet::AddLibrary
                          (local_c90,
                           (cmInstallImportedRuntimeArtifactsGenerator *)local_c30.View_._M_len);
                pcVar11 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
              }
              else {
                (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
                          ((string *)&local_c30,&helper,&libraryArgs);
                HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                          ((anon_class_48_1_585e00ec *)&system,(cmTarget *)&createInstallGenerator,
                           typeArgs,(string *)&libraryArgs);
                library = system._M_dataplus;
                system._M_dataplus._M_p = (pointer)0x0;
                std::__cxx11::string::~string((string *)&local_c30);
                if (local_c90 == (cmInstallRuntimeDependencySet *)0x0) goto LAB_002a721a;
                executable._M_head_impl = (cmInstallGenerator *)0x0;
                pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                cmInstallRuntimeDependencySet::AddLibrary
                          (local_c90,(cmInstallImportedRuntimeArtifactsGenerator *)library._M_p);
                pcVar11 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
              }
            }
          }
          else {
            if (TVar5 != MODULE_LIBRARY) {
              __assert_fail("false && \"This should never happen\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallCommand.cxx"
                            ,0x5bc,
                            "bool (anonymous namespace)::HandleImportedRuntimeArtifactsMode(const std::vector<std::string> &, cmExecutionStatus &)"
                           );
            }
            (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
                      ((string *)&local_c30,&helper,&libraryArgs);
            HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                      ((anon_class_48_1_585e00ec *)&system,(cmTarget *)&createInstallGenerator,
                       typeArgs,(string *)&libraryArgs);
            library = system._M_dataplus;
            system._M_dataplus._M_p = (pointer)0x0;
            std::__cxx11::string::~string((string *)&local_c30);
            if (local_c90 == (cmInstallRuntimeDependencySet *)0x0) {
LAB_002a721a:
              executable._M_head_impl = (cmInstallGenerator *)0x0;
LAB_002a721d:
              pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
LAB_002a721f:
              pcVar11 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
            }
            else {
              executable._M_head_impl = (cmInstallGenerator *)0x0;
              pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
              cmInstallRuntimeDependencySet::AddModule
                        (local_c90,(cmInstallImportedRuntimeArtifactsGenerator *)library._M_p);
              pcVar11 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
            }
          }
          local_c88 = pcVar11;
          local_c38._M_head_impl = (cmInstallGenerator *)library._M_p;
          cmMakefile::AddInstallGenerator
                    (helper.Makefile,
                     (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                     &local_c38);
          if (local_c38._M_head_impl != (cmInstallGenerator *)0x0) {
            (*((local_c38._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
          }
          local_c38._M_head_impl = (cmInstallGenerator *)0x0;
          local_c40._M_t.
          super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>.
          super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl =
               (tuple<cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>)
               (tuple<cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>)
               executable._M_head_impl;
          cmMakefile::AddInstallGenerator
                    (helper.Makefile,
                     (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                     &local_c40);
          if ((_Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>)
              local_c40._M_t.
              super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
              .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl !=
              (cmInstallGenerator *)0x0) {
            (**(code **)(*(long *)local_c40._M_t.
                                  super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                                  .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl +
                        8))();
          }
          local_c40._M_t.
          super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>.
          super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl =
               (tuple<cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>)
               (_Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>)0x0
          ;
          local_c48._M_head_impl = &pcVar14->super_cmInstallGenerator;
          cmMakefile::AddInstallGenerator
                    (helper.Makefile,
                     (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                     &local_c48);
          if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c48._M_head_impl !=
              (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
            (*(((cmInstallGenerator *)&(local_c48._M_head_impl)->super_cmScriptGenerator)->
              super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
          }
          local_c48._M_head_impl = (cmInstallGenerator *)0x0;
          local_c50._M_head_impl = &local_c88->super_cmInstallGenerator;
          cmMakefile::AddInstallGenerator
                    (helper.Makefile,
                     (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                     &local_c50);
          if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c50._M_head_impl !=
              (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
            (*(((cmInstallGenerator *)&(local_c50._M_head_impl)->super_cmScriptGenerator)->
              super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
          }
          bVar12 = (bool)(bVar12 | (cmInstallGenerator *)library._M_p != (cmInstallGenerator *)0x0);
          local_be0 = CONCAT71((int7)(local_be0 >> 8),
                               (byte)local_be0 |
                               (_Head_base<0UL,_cmInstallGenerator_*,_false>)executable._M_head_impl
                               != (_Head_base<0UL,_cmInstallGenerator_*,_false>)0x0);
          bVar13 = (bool)(bVar13 | pcVar14 != (cmInstallImportedRuntimeArtifactsGenerator *)0x0);
          bVar15 = (bool)(bVar15 | pcVar11 != (cmInstallImportedRuntimeArtifactsGenerator *)0x0);
          local_c50._M_head_impl = (cmInstallGenerator *)0x0;
        }
        if (bVar12) {
          pcVar8 = cmMakefile::GetGlobalGenerator(helper.Makefile);
          psVar7 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&libraryArgs);
          cmGlobalGenerator::AddInstallComponent(pcVar8,psVar7);
        }
        if ((local_be0 & 1) != 0) {
          pcVar8 = cmMakefile::GetGlobalGenerator(helper.Makefile);
          psVar7 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&runtimeArgs);
          cmGlobalGenerator::AddInstallComponent(pcVar8,psVar7);
        }
        if (bVar13) {
          pcVar8 = cmMakefile::GetGlobalGenerator(helper.Makefile);
          psVar7 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&frameworkArgs);
          cmGlobalGenerator::AddInstallComponent(pcVar8,psVar7);
        }
        if (bVar15) {
          pcVar8 = cmMakefile::GetGlobalGenerator(helper.Makefile);
          psVar7 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&bundleArgs);
          cmGlobalGenerator::AddInstallComponent(pcVar8,psVar7);
        }
LAB_002a7637:
        std::__cxx11::string::~string((string *)&createInstallGenerator.helper.DefaultComponentName)
        ;
      }
      goto LAB_002a6dc4;
    }
  }
  else {
    createInstallGenerator.helper.Status = (cmExecutionStatus *)0x33;
    createInstallGenerator.helper.Makefile = (cmMakefile *)anon_var_dwarf_ad6ca0;
    local_c30.View_._M_str =
         ((unknownArgs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_c30.View_._M_len =
         (unknownArgs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    cmStrCat<char[3]>(&system,(cmAlphaNum *)&createInstallGenerator,&local_c30,
                      (char (*) [3])0x5b59a8);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002a6b26:
    std::__cxx11::string::~string((string *)&system);
  }
LAB_002a6dc1:
  bVar3 = false;
LAB_002a6dc4:
  cmInstallCommandArguments::~cmInstallCommandArguments(&bundleArgs);
  cmInstallCommandArguments::~cmInstallCommandArguments(&frameworkArgs);
  cmInstallCommandArguments::~cmInstallCommandArguments(&runtimeArgs);
  cmInstallCommandArguments::~cmInstallCommandArguments(&libraryArgs);
  cmInstallCommandArguments::~cmInstallCommandArguments(&genericArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  std::__cxx11::string::~string((string *)&runtimeDependencySetArg);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&targetList.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  HandleImportedRuntimeArtifactsMode::ArgVectors::~ArgVectors(&argVectors);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&genericArgVector);
  std::_Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>::~_Vector_base
            (&targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>);
  std::__cxx11::string::~string((string *)this);
  return bVar3;
}

Assistant:

bool HandleImportedRuntimeArtifactsMode(std::vector<std::string> const& args,
                                        cmExecutionStatus& status)
{
  Helper helper(status);

  // This is the IMPORTED_RUNTIME_ARTIFACTS mode.
  std::vector<cmTarget*> targets;

  struct ArgVectors
  {
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Library;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Runtime;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Framework;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Bundle;
  };

  static auto const argHelper = cmArgumentParser<ArgVectors>{}
                                  .Bind("LIBRARY"_s, &ArgVectors::Library)
                                  .Bind("RUNTIME"_s, &ArgVectors::Runtime)
                                  .Bind("FRAMEWORK"_s, &ArgVectors::Framework)
                                  .Bind("BUNDLE"_s, &ArgVectors::Bundle);

  std::vector<std::string> genericArgVector;
  ArgVectors const argVectors = argHelper.Parse(args, &genericArgVector);

  // now parse the generic args (i.e. the ones not specialized on LIBRARY,
  // RUNTIME etc. (see above)
  ArgumentParser::MaybeEmpty<std::vector<std::string>> targetList;
  std::string runtimeDependencySetArg;
  std::vector<std::string> unknownArgs;
  cmInstallCommandArguments genericArgs(helper.DefaultComponentName);
  genericArgs.Bind("IMPORTED_RUNTIME_ARTIFACTS"_s, targetList)
    .Bind("RUNTIME_DEPENDENCY_SET"_s, runtimeDependencySetArg);
  genericArgs.Parse(genericArgVector, &unknownArgs);
  bool success = genericArgs.Finalize();

  cmInstallCommandArguments libraryArgs(helper.DefaultComponentName);
  cmInstallCommandArguments runtimeArgs(helper.DefaultComponentName);
  cmInstallCommandArguments frameworkArgs(helper.DefaultComponentName);
  cmInstallCommandArguments bundleArgs(helper.DefaultComponentName);

  // now parse the args for specific parts of the target (e.g. LIBRARY,
  // RUNTIME etc.
  libraryArgs.Parse(argVectors.Library, &unknownArgs);
  runtimeArgs.Parse(argVectors.Runtime, &unknownArgs);
  frameworkArgs.Parse(argVectors.Framework, &unknownArgs);
  bundleArgs.Parse(argVectors.Bundle, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given unknown argument \"",
               unknownArgs[0], "\"."));
    return false;
  }

  // apply generic args
  libraryArgs.SetGenericArguments(&genericArgs);
  runtimeArgs.SetGenericArguments(&genericArgs);
  frameworkArgs.SetGenericArguments(&genericArgs);
  bundleArgs.SetGenericArguments(&genericArgs);

  success = success && libraryArgs.Finalize();
  success = success && runtimeArgs.Finalize();
  success = success && frameworkArgs.Finalize();
  success = success && bundleArgs.Finalize();

  if (!success) {
    return false;
  }

  cmInstallRuntimeDependencySet* runtimeDependencySet = nullptr;
  if (!runtimeDependencySetArg.empty()) {
    auto system = helper.Makefile->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
    if (!cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(
          system)) {
      status.SetError(
        cmStrCat("IMPORTED_RUNTIME_ARTIFACTS RUNTIME_DEPENDENCY_SET is not "
                 "supported on system \"",
                 system, '"'));
      return false;
    }
    runtimeDependencySet =
      helper.Makefile->GetGlobalGenerator()->GetNamedRuntimeDependencySet(
        runtimeDependencySetArg);
  }

  // Check if there is something to do.
  if (targetList.empty()) {
    return true;
  }

  for (std::string const& tgt : targetList) {
    if (helper.Makefile->IsAlias(tgt)) {
      status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"",
                               tgt, "\" which is an alias."));
      return false;
    }
    // Lookup this target in the current directory.
    cmTarget* target = helper.Makefile->FindTargetToUse(tgt);
    if (!target || !target->IsImported()) {
      // If no local target has been found, find it in the global scope.
      cmTarget* const global_target =
        helper.Makefile->GetGlobalGenerator()->FindTarget(tgt, true);
      if (global_target && global_target->IsImported()) {
        target = global_target;
      }
    }
    if (target) {
      // Found the target.  Check its type.
      if (target->GetType() != cmStateEnums::EXECUTABLE &&
          target->GetType() != cmStateEnums::SHARED_LIBRARY &&
          target->GetType() != cmStateEnums::MODULE_LIBRARY) {
        status.SetError(
          cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"", tgt,
                   "\" which is not an executable, library, or module."));
        return false;
      }
      // Store the target in the list to be installed.
      targets.push_back(target);
    } else {
      // Did not find the target.
      status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"",
                               tgt, "\" which does not exist."));
      return false;
    }
  }

  // Keep track of whether we will be performing an installation of
  // any files of the given type.
  bool installsLibrary = false;
  bool installsRuntime = false;
  bool installsFramework = false;
  bool installsBundle = false;

  auto const createInstallGenerator =
    [helper](cmTarget& target, const cmInstallCommandArguments& typeArgs,
             const std::string& destination)
    -> std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator> {
    return cm::make_unique<cmInstallImportedRuntimeArtifactsGenerator>(
      target.GetName(), destination, typeArgs.GetPermissions(),
      typeArgs.GetConfigurations(), typeArgs.GetComponent(),
      cmInstallGenerator::SelectMessageLevel(helper.Makefile),
      typeArgs.GetExcludeFromAll(), typeArgs.GetOptional(),
      helper.Makefile->GetBacktrace());
  };

  // Generate install script code to install the given targets.
  for (cmTarget* ti : targets) {
    // Handle each target type.
    cmTarget& target = *ti;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      libraryGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      runtimeGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      frameworkGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      bundleGenerator;

    switch (target.GetType()) {
      case cmStateEnums::SHARED_LIBRARY:
        if (target.IsDLLPlatform()) {
          runtimeGenerator = createInstallGenerator(
            target, runtimeArgs, helper.GetRuntimeDestination(&runtimeArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(runtimeGenerator.get());
          }
        } else if (target.IsFrameworkOnApple()) {
          if (frameworkArgs.GetDestination().empty()) {
            status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given no "
                                     "FRAMEWORK DESTINATION for shared "
                                     "library FRAMEWORK target \"",
                                     target.GetName(), "\"."));
            return false;
          }
          frameworkGenerator = createInstallGenerator(
            target, frameworkArgs, frameworkArgs.GetDestination());
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(frameworkGenerator.get());
          }
        } else {
          libraryGenerator = createInstallGenerator(
            target, libraryArgs, helper.GetLibraryDestination(&libraryArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(libraryGenerator.get());
          }
        }
        break;
      case cmStateEnums::MODULE_LIBRARY:
        libraryGenerator = createInstallGenerator(
          target, libraryArgs, helper.GetLibraryDestination(&libraryArgs));
        if (runtimeDependencySet) {
          runtimeDependencySet->AddModule(libraryGenerator.get());
        }
        break;
      case cmStateEnums::EXECUTABLE:
        if (target.IsAppBundleOnApple()) {
          if (bundleArgs.GetDestination().empty()) {
            status.SetError(
              cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given no BUNDLE "
                       "DESTINATION for MACOSX_BUNDLE executable target \"",
                       target.GetName(), "\"."));
            return false;
          }
          bundleGenerator = createInstallGenerator(
            target, bundleArgs, bundleArgs.GetDestination());
          if (runtimeDependencySet) {
            if (!AddBundleExecutable(helper, runtimeDependencySet,
                                     bundleGenerator.get())) {
              return false;
            }
          }
        } else {
          runtimeGenerator = createInstallGenerator(
            target, runtimeArgs, helper.GetRuntimeDestination(&runtimeArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddExecutable(runtimeGenerator.get());
          }
        }
        break;
      default:
        assert(false && "This should never happen");
        break;
    }

    // Keep track of whether we're installing anything in each category
    installsLibrary = installsLibrary || libraryGenerator;
    installsRuntime = installsRuntime || runtimeGenerator;
    installsFramework = installsFramework || frameworkGenerator;
    installsBundle = installsBundle || bundleGenerator;

    helper.Makefile->AddInstallGenerator(std::move(libraryGenerator));
    helper.Makefile->AddInstallGenerator(std::move(runtimeGenerator));
    helper.Makefile->AddInstallGenerator(std::move(frameworkGenerator));
    helper.Makefile->AddInstallGenerator(std::move(bundleGenerator));
  }

  // Tell the global generator about any installation component names
  // specified
  if (installsLibrary) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      libraryArgs.GetComponent());
  }
  if (installsRuntime) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      runtimeArgs.GetComponent());
  }
  if (installsFramework) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      frameworkArgs.GetComponent());
  }
  if (installsBundle) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      bundleArgs.GetComponent());
  }

  return true;
}